

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::goToDirectory(QFileDialogPrivate *this,QString *path)

{
  QWidget *this_00;
  QFileSystemModel *pQVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  QAbstractItemModel *pQVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  QFileDialogPrivate *pQVar9;
  long in_FS_OFFSET;
  QDir dir;
  QArrayDataPointer<char16_t> local_d0;
  Data *local_b8;
  char16_t *pcStack_b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_a8;
  undefined1 local_98 [16];
  QAbstractItemModel *local_88;
  PrivateShared *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar9 = (QFileDialogPrivate *)
           QComboBox::model(&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox);
  iVar7 = QComboBox::currentIndex(&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox);
  iVar8 = QComboBox::modelColumn(&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox);
  QComboBox::rootModelIndex
            ((QModelIndex *)&local_58,&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox);
  (**(code **)(*(long *)&(pQVar9->super_QDialogPrivate).super_QWidgetPrivate + 0x60))
            (&local_78,pQVar9,iVar7,iVar8,&local_58);
  local_98._0_8_ = (path->d).d;
  local_98._8_8_ = (path->d).ptr;
  local_88 = (QAbstractItemModel *)(path->d).size;
  if ((Data *)local_98._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_98._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_98._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  if ((((int)local_78 < 0) || ((long)local_78 < 0)) || (local_68.ptr == (QAbstractItemModel *)0x0))
  {
    pQVar1 = this->model;
    getEnvironmentVariable((QString *)&local_d0,pQVar9,path);
    QFileSystemModel::index((QString *)&local_b8,(int)pQVar1);
    mapFromSource((QModelIndex *)&local_58,this,(QModelIndex *)&local_b8);
    local_68.ptr = (QAbstractItemModel *)local_58._16_8_;
    local_78 = local_58.shared;
    puStack_70 = (undefined1 *)local_58._8_8_;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  }
  else {
    QModelIndex::data((QVariant *)&local_58,(QModelIndex *)&local_78,0x101);
    ::QVariant::toUrl();
    QUrl::toLocalFile();
    pQVar4 = local_88;
    uVar3 = local_98._8_8_;
    uVar2 = local_98._0_8_;
    local_98._0_8_ = local_b8;
    local_98._8_8_ = pcStack_b0;
    local_b8 = (Data *)uVar2;
    pcStack_b0 = (char16_t *)uVar3;
    local_88 = local_a8.ptr;
    local_a8.ptr = pQVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    QUrl::~QUrl((QUrl *)&local_d0);
    ::QVariant::~QVariant((QVariant *)&local_58);
    QFileSystemModel::index((QString *)&local_b8,(int)this->model);
    mapFromSource((QModelIndex *)&local_58,this,(QModelIndex *)&local_b8);
    local_68.ptr = (QAbstractItemModel *)local_58._16_8_;
    local_78 = local_58.shared;
    puStack_70 = (undefined1 *)local_58._8_8_;
  }
  _dir = &DAT_aaaaaaaaaaaaaaaa;
  pQVar9 = (QFileDialogPrivate *)local_98;
  QDir::QDir(&dir,(QString *)pQVar9);
  cVar5 = QDir::exists();
  if (cVar5 == '\0') {
    getEnvironmentVariable((QString *)&local_58,pQVar9,(QString *)local_98);
    QDir::setPath((QString *)&dir);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  }
  cVar5 = QDir::exists();
  if ((cVar5 == '\0') && (local_88 != (QAbstractItemModel *)0x0)) {
    QFileSystemModel::myComputer((int)&local_58);
    ::QVariant::toString();
    bVar6 = ::comparesEqual((QString *)local_98,(QString *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (!bVar6) {
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QFileDialog::tr((QString *)&local_58,
                      "%1\nDirectory not found.\nPlease verify the correct directory name was given."
                      ,(char *)0x0,-1);
      QWidget::windowTitle((QString *)&local_b8,this_00);
      QString::arg<QString,_true>
                ((QString *)&local_d0,(QString *)&local_58,(QString *)local_98,0,(QChar)0x20);
      QMessageBox::warning
                (this_00,(QString *)&local_b8,(QString *)&local_d0,(StandardButtons)0x400,NoButton);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      goto LAB_0049fdd9;
    }
  }
  enterDirectory(this,(QModelIndex *)&local_78);
LAB_0049fdd9:
  QDir::~QDir(&dir);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::goToDirectory(const QString &path)
{
    enum { UrlRole = Qt::UserRole + 1 };

 #if QT_CONFIG(messagebox)
    Q_Q(QFileDialog);
#endif
    QModelIndex index = qFileDialogUi->lookInCombo->model()->index(qFileDialogUi->lookInCombo->currentIndex(),
                                                    qFileDialogUi->lookInCombo->modelColumn(),
                                                    qFileDialogUi->lookInCombo->rootModelIndex());
    QString path2 = path;
    if (!index.isValid())
        index = mapFromSource(model->index(getEnvironmentVariable(path)));
    else {
        path2 = index.data(UrlRole).toUrl().toLocalFile();
        index = mapFromSource(model->index(path2));
    }
    QDir dir(path2);
    if (!dir.exists())
        dir.setPath(getEnvironmentVariable(path2));

    if (dir.exists() || path2.isEmpty() || path2 == model->myComputer().toString()) {
        enterDirectory(index);
#if QT_CONFIG(messagebox)
    } else {
        QString message = QFileDialog::tr("%1\nDirectory not found.\nPlease verify the "
                                          "correct directory name was given.");
        QMessageBox::warning(q, q->windowTitle(), message.arg(path2));
#endif // QT_CONFIG(messagebox)
    }
}